

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-spawn.c
# Opt level: O2

int run_test_spawn_tcp_server(void)

{
  int iVar1;
  undefined8 uVar2;
  uv_loop_t *loop;
  uv_stdio_flags uVar3;
  char *pcVar4;
  int fd;
  sockaddr_in addr;
  uv_stdio_container_t stdio [4];
  
  init_process_options("spawn_tcp_server_helper",exit_cb);
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,&addr);
  if (iVar1 == 0) {
    fd = -1;
    uVar2 = uv_default_loop();
    uVar3 = UV_INHERIT_FD;
    iVar1 = uv_tcp_init_ex(uVar2,&tcp_server,2);
    if (iVar1 == 0) {
      iVar1 = uv_tcp_bind(&tcp_server,&addr,0);
      if (iVar1 == 0) {
        iVar1 = uv_fileno(&tcp_server,&fd);
        if (iVar1 == 0) {
          if (fd < 1) {
            pcVar4 = "fd > 0";
            uVar2 = 0x2c5;
          }
          else {
            options.stdio = stdio;
            stdio[0].data.fd = 0;
            stdio[1].data.fd = 1;
            stdio[3].data.fd = fd;
            options.stdio_count = 4;
            stdio[0].flags = uVar3;
            stdio[1].flags = uVar3;
            stdio[2].flags = uVar3;
            stdio[2].data._0_4_ = uVar3;
            stdio[3].flags = uVar3;
            uVar2 = uv_default_loop();
            iVar1 = uv_spawn(uVar2,&process,&options);
            if (iVar1 == 0) {
              uVar2 = uv_default_loop();
              iVar1 = uv_run(uVar2,0);
              if (iVar1 == 0) {
                if (exit_cb_called == 1) {
                  if (close_cb_called == 1) {
                    loop = (uv_loop_t *)uv_default_loop();
                    close_loop(loop);
                    uVar2 = uv_default_loop();
                    iVar1 = uv_loop_close(uVar2);
                    if (iVar1 == 0) {
                      uv_library_shutdown();
                      return 0;
                    }
                    pcVar4 = "0 == uv_loop_close(uv_default_loop())";
                    uVar2 = 0x2db;
                  }
                  else {
                    pcVar4 = "close_cb_called == 1";
                    uVar2 = 0x2d9;
                  }
                }
                else {
                  pcVar4 = "exit_cb_called == 1";
                  uVar2 = 0x2d8;
                }
              }
              else {
                pcVar4 = "r == 0";
                uVar2 = 0x2d6;
              }
            }
            else {
              pcVar4 = "r == 0";
              uVar2 = 0x2d3;
            }
          }
        }
        else {
          pcVar4 = "r == 0";
          uVar2 = 0x2c4;
        }
      }
      else {
        pcVar4 = "r == 0";
        uVar2 = 0x2bd;
      }
    }
    else {
      pcVar4 = "r == 0";
      uVar2 = 699;
    }
  }
  else {
    pcVar4 = "0 == uv_ip4_addr(\"127.0.0.1\", TEST_PORT, &addr)";
    uVar2 = 0x2b7;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-spawn.c",
          uVar2,pcVar4);
  abort();
}

Assistant:

TEST_IMPL(spawn_tcp_server) {
  uv_stdio_container_t stdio[4];
  struct sockaddr_in addr;
  int fd;
  int r;
#ifdef _WIN32
  uv_os_fd_t handle;
#endif

  init_process_options("spawn_tcp_server_helper", exit_cb);

  ASSERT(0 == uv_ip4_addr("127.0.0.1", TEST_PORT, &addr));

  fd = -1;
  r = uv_tcp_init_ex(uv_default_loop(), &tcp_server, AF_INET);
  ASSERT(r == 0);
  r = uv_tcp_bind(&tcp_server, (const struct sockaddr*) &addr, 0);
  ASSERT(r == 0);
#ifdef _WIN32
  r = uv_fileno((uv_handle_t*) &tcp_server, &handle);
  fd = _open_osfhandle((intptr_t) handle, 0);
#else
  r = uv_fileno((uv_handle_t*) &tcp_server, &fd);
 #endif
  ASSERT(r == 0);
  ASSERT(fd > 0);

  options.stdio = stdio;
  options.stdio[0].flags = UV_INHERIT_FD;
  options.stdio[0].data.fd = 0;
  options.stdio[1].flags = UV_INHERIT_FD;
  options.stdio[1].data.fd = 1;
  options.stdio[2].flags = UV_INHERIT_FD;
  options.stdio[2].data.fd = 2;
  options.stdio[3].flags = UV_INHERIT_FD;
  options.stdio[3].data.fd = fd;
  options.stdio_count = 4;

  r = uv_spawn(uv_default_loop(), &process, &options);
  ASSERT(r == 0);

  r = uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  ASSERT(r == 0);

  ASSERT(exit_cb_called == 1);
  ASSERT(close_cb_called == 1);

  MAKE_VALGRIND_HAPPY();
  return 0;
}